

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmf(fitsfile *gfptr,char *xtension,char *extname,int extver,int position,char *location,
         long *member,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  char *local_2518;
  char *tmpPtr [2];
  char local_24f9;
  char local_24f8 [7];
  char nstr [1];
  char cwd [1025];
  char local_20e8 [8];
  char grpLocation2 [1025];
  char local_1cd8 [8];
  char grpLocation1 [1025];
  char local_18c8 [8];
  char mbrLocation3 [1025];
  char local_14b8 [8];
  char mbrLocation2 [1025];
  char local_10a8 [8];
  char mbrLocation1 [1025];
  char local_c98 [8];
  char tmpLocation [1025];
  char local_888 [8];
  char charBuff2 [1025];
  char local_478 [8];
  char charBuff1 [1025];
  long mextver;
  long nmembers;
  int i;
  int dummy;
  int grptype;
  int mposition;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  char *location_local;
  int position_local;
  int extver_local;
  char *extname_local;
  char *xtension_local;
  fitsfile *gfptr_local;
  
  dummy = 0;
  mextver = 0;
  stack0xffffffffffffff90 = 0;
  _extnameCol = location;
  location_local._0_4_ = position;
  location_local._4_4_ = extver;
  _position_local = extname;
  extname_local = xtension;
  xtension_local = (char *)gfptr;
  memset(&local_24f9,0,1);
  if (*status == 0) {
    *member = 0;
    local_2518 = local_478;
    tmpPtr[0] = local_888;
    if (*status == 0) {
      if (_extnameCol == (char *)0x0) {
        local_c98[0] = '\0';
      }
      else if (*_extnameCol == '\0') {
        local_c98[0] = '\0';
      }
      else {
        iVar1 = fits_is_url_absolute(_extnameCol);
        if (iVar1 == 0) {
          fits_path2url(_extnameCol,0x401,local_c98,status);
          if (local_c98[0] != '/') {
            fits_get_cwd(local_24f8,status);
            sVar2 = strlen(local_24f8);
            sVar3 = strlen(local_c98);
            if (0x400 < sVar2 + sVar3 + 1) {
              ffpmsg("cwd and location are too long (ffgmf)");
              *status = 0x7d;
              return 0x7d;
            }
            strcat(local_24f8,"/");
            strcat(local_24f8,local_c98);
            fits_clean_url(local_24f8,local_c98,status);
          }
        }
        else {
          strcpy(local_c98,_extnameCol);
        }
      }
      iVar1 = ffgtgc((fitsfile *)xtension_local,&extverCol,&positionCol,&locationCol,&uriCol,
                     &mposition,&grptype,&i,status);
      *status = iVar1;
      iVar1 = ffgtnm((fitsfile *)xtension_local,&mextver,status);
      *status = iVar1;
      nmembers._0_4_ = 1;
      while( true ) {
        bVar4 = false;
        if (((int)nmembers <= mextver) && (bVar4 = false, *member == 0)) {
          bVar4 = *status == 0;
        }
        if (!bVar4) break;
        if (extverCol == 0) {
LAB_0021528d:
          if (positionCol != 0) {
            ffgcvs((fitsfile *)xtension_local,positionCol,(long)(int)nmembers,1,1,&local_24f9,
                   &local_2518,(int *)((long)&nmembers + 4),status);
            iVar1 = fits_strcasecmp(local_2518,_position_local);
            if (iVar1 != 0) goto LAB_00215923;
          }
          if (((locationCol == 0) ||
              (ffgcvj((fitsfile *)xtension_local,locationCol,(long)(int)nmembers,1,1,0,
                      (long *)(charBuff1 + 0x400),(int *)((long)&nmembers + 4),status),
              location_local._4_4_ == stack0xffffffffffffff90)) &&
             ((uriCol == 0 ||
              (((i != 2 && (i != 0xc)) ||
               (ffgcvk((fitsfile *)xtension_local,uriCol,(long)(int)nmembers,1,1,0,&dummy,
                       (int *)((long)&nmembers + 4),status), (int)location_local == dummy)))))) {
            if (_extnameCol == (char *)0x0) {
              ffpmsg("NULL Location string given ==> ignore location (ffgmf)");
              *member = (long)(int)nmembers;
            }
            else {
              if (mposition == 0) {
                local_10a8[0] = '\0';
              }
              else {
                ffgcvs((fitsfile *)xtension_local,mposition,(long)(int)nmembers,1,1,&local_24f9,
                       &local_2518,(int *)((long)&nmembers + 4),status);
                strcpy(local_10a8,local_2518);
                local_14b8[0] = '\0';
              }
              if (local_10a8[0] == '\0') {
                iVar1 = fits_get_url((fitsfile *)xtension_local,local_10a8,local_14b8,(char *)0x0,
                                     (char *)0x0,(int *)0x0,status);
                *status = iVar1;
                if (((local_10a8[0] != '\0') &&
                    (iVar1 = fits_is_url_absolute(local_10a8), iVar1 == 0)) &&
                   (local_10a8[0] != '/')) {
                  fits_get_cwd(local_24f8,status);
                  sVar2 = strlen(local_24f8);
                  sVar3 = strlen(local_10a8);
                  if (0x400 < sVar2 + sVar3 + 1) {
                    ffpmsg("cwd and member locations are too long (ffgmf)");
                    *status = 0x7d;
                    goto LAB_00215923;
                  }
                  strcat(local_24f8,"/");
                  strcat(local_24f8,local_10a8);
                  fits_clean_url(local_24f8,local_10a8,status);
                }
                if (((local_14b8[0] != '\0') &&
                    (iVar1 = fits_is_url_absolute(local_14b8), iVar1 == 0)) &&
                   (local_14b8[0] != '/')) {
                  fits_get_cwd(local_24f8,status);
                  sVar2 = strlen(local_24f8);
                  sVar3 = strlen(local_14b8);
                  if (0x400 < sVar2 + sVar3 + 1) {
                    ffpmsg("cwd and member locations are too long (ffgmf)");
                    *status = 0x7d;
                    goto LAB_00215923;
                  }
                  strcat(local_24f8,"/");
                  strcat(local_24f8,local_14b8);
                  fits_clean_url(local_24f8,local_14b8,status);
                }
              }
              else {
                iVar1 = fits_is_url_absolute(local_10a8);
                if ((iVar1 == 0) && (local_10a8[0] != '/')) {
                  strcpy(local_14b8,local_10a8);
                  iVar1 = fits_get_url((fitsfile *)xtension_local,local_1cd8,local_20e8,(char *)0x0,
                                       (char *)0x0,(int *)0x0,status);
                  *status = iVar1;
                  if (local_1cd8[0] == '\0') {
                    local_10a8[0] = '\0';
                  }
                  else {
                    iVar1 = fits_is_url_absolute(local_1cd8);
                    if ((iVar1 == 0) && (local_1cd8[0] != '/')) {
                      fits_get_cwd(local_24f8,status);
                      sVar2 = strlen(local_24f8);
                      sVar3 = strlen(local_1cd8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg("cwd and group locations are too long (ffgmf)");
                        *status = 0x7d;
                        goto LAB_00215923;
                      }
                      strcat(local_24f8,"/");
                      strcat(local_24f8,local_1cd8);
                      fits_clean_url(local_24f8,local_1cd8,status);
                    }
                    fits_relurl2url(local_1cd8,local_10a8,local_18c8,status);
                    if (*status == 0) {
                      strcpy(local_10a8,local_18c8);
                    }
                    else if (*status == 0x7d) {
                      *status = 0;
                      local_10a8[0] = '\0';
                    }
                  }
                  if (local_20e8[0] == '\0') {
                    local_14b8[0] = '\0';
                  }
                  else {
                    iVar1 = fits_is_url_absolute(local_20e8);
                    if ((iVar1 == 0) && (local_20e8[0] != '/')) {
                      fits_get_cwd(local_24f8,status);
                      sVar2 = strlen(local_24f8);
                      sVar3 = strlen(local_20e8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg("cwd and group locations are too long (ffgmf)");
                        *status = 0x7d;
                        goto LAB_00215923;
                      }
                      strcat(local_24f8,"/");
                      strcat(local_24f8,local_20e8);
                      fits_clean_url(local_24f8,local_20e8,status);
                    }
                    fits_relurl2url(local_20e8,local_14b8,local_18c8,status);
                    if (*status == 0) {
                      strcpy(local_14b8,local_18c8);
                    }
                    else if (*status == 0x7d) {
                      *status = 0;
                      local_14b8[0] = '\0';
                    }
                  }
                }
              }
              iVar1 = strcmp(local_10a8,local_c98);
              if ((iVar1 == 0) || (iVar1 = strcmp(local_14b8,local_c98), iVar1 == 0)) {
                *member = (long)(int)nmembers;
              }
            }
          }
        }
        else {
          ffgcvs((fitsfile *)xtension_local,extverCol,(long)(int)nmembers,1,1,&local_24f9,
                 &local_2518,(int *)((long)&nmembers + 4),status);
          iVar1 = fits_strcasecmp(local_2518,extname_local);
          if (iVar1 == 0) goto LAB_0021528d;
        }
LAB_00215923:
        nmembers._0_4_ = (int)nmembers + 1;
      }
      if ((*member == 0) && (*status == 0)) {
        *status = 0x156;
        ffpmsg("Cannot find specified member HDU (ffgmf)");
      }
      gfptr_local._4_4_ = *status;
    }
    else {
      gfptr_local._4_4_ = *status;
    }
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgmf(fitsfile *gfptr, /* pointer to grouping table HDU to search       */
	   char *xtension,  /* XTENSION value for member HDU                */
	   char *extname,   /* EXTNAME value for member HDU                 */
	   int   extver,    /* EXTVER value for member HDU                  */
	   int   position,  /* HDU position value for member HDU            */
	   char *location,  /* FITS file location value for member HDU      */
	   long *member,    /* member HDU ID within group table (if found)  */
	   int  *status)    /* return status code                           */

/*
   try to find the entry for the member HDU defined by the xtension, extname,
   extver, position, and location parameters within the grouping table
   pointed to by gfptr. If the member HDU is found then its ID (row number)
   within the grouping table is returned in the member variable; if not
   found then member is returned with a value of 0 and the status return
   code will be set to MEMBER_NOT_FOUND.

   Note that the member HDU postion information is used to obtain a member
   match only if the grouping table type is GT_ID_POS_URI or GT_ID_POS. This
   is because the position information can become invalid much more
   easily then the reference information for a group member.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int mposition = 0;
  int grptype;
  int dummy;
  int i;

  long nmembers = 0;
  long mextver  = 0;
 
  char  charBuff1[FLEN_FILENAME];
  char  charBuff2[FLEN_FILENAME];
  char  tmpLocation[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];

  char  nstr[] = {'\0'};
  char *tmpPtr[2];

  if(*status != 0) return(*status);

  *member = 0;

  tmpPtr[0] = charBuff1;
  tmpPtr[1] = charBuff2;


  if(*status != 0) return(*status);

  /*
    if the passed LOCATION value is not an absolute URL then turn it
    into an absolute path
  */

  if(location == NULL)
    {
      *tmpLocation = 0;
    }

  else if(*location == 0)
    {
      *tmpLocation = 0;
    }

  else if(!fits_is_url_absolute(location))
    {
      fits_path2url(location,FLEN_FILENAME,tmpLocation,status);

      if(*tmpLocation != '/')
	{
	  fits_get_cwd(cwd,status);
          if (strlen(cwd)+strlen(tmpLocation)+1 > 
                    FLEN_FILENAME-1)
          {
             ffpmsg("cwd and location are too long (ffgmf)");
             return (*status = URL_PARSE_ERROR);
          }
	  strcat(cwd,"/");
	  strcat(cwd,tmpLocation);
	  fits_clean_url(cwd,tmpLocation,status);
	}
    }

  else
    strcpy(tmpLocation,location);

  /*
     retrieve the Grouping Convention reserved column positions within
     the grouping table
  */

  *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		   &locationCol,&uriCol,&grptype,status);

  /* retrieve the number of group members */

  *status = fits_get_num_members(gfptr,&nmembers,status);
	      
  /* 
     loop over all grouping table rows until the member HDU is found 
  */

  for(i = 1; i <= nmembers && *member == 0 && *status == 0; ++i)
    {
      if(xtensionCol != 0)
	{
	  fits_read_col_str(gfptr,xtensionCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],xtension) != 0) continue;
	}
	  
      if(extnameCol  != 0)
	{
	  fits_read_col_str(gfptr,extnameCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],extname) != 0) continue;
	}
	  
      if(extverCol   != 0)
	{
	  fits_read_col_lng(gfptr,extverCol,i,1,1,0,
			    (long*)&mextver,&dummy,status);
	  if(extver != mextver) continue;
	}
      
      /* note we only use postionCol if we have to */

      if(positionCol != 0 && 
	            (grptype == GT_ID_POS || grptype == GT_ID_POS_URI))
	{
	  fits_read_col_int(gfptr,positionCol,i,1,1,0,
			    &mposition,&dummy,status);
	  if(position != mposition) continue;
	}
      
      /*
	if no location string was passed to the function then assume that
	the calling application does not wish to use it as a comparision
	critera ==> if we got this far then we have a match
      */

      if(location == NULL)
	{
	  ffpmsg("NULL Location string given ==> ignore location (ffgmf)");
	  *member = i;
	  continue;
	}

      /*
	if the grouping table MEMBER_LOCATION column exists then read the
	location URL for the member, else set the location string to
	a zero-length string for subsequent comparisions
      */

      if(locationCol != 0)
	{
	  fits_read_col_str(gfptr,locationCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  strcpy(mbrLocation1,tmpPtr[0]);
	  *mbrLocation2 = 0;
	}
      else
	*mbrLocation1 = 0;

      /* 
	 if the member location string from the grouping table is zero 
	 length (either implicitly or explicitly) then assume that the 
	 member HDU is in the same file as the grouping table HDU; retrieve
	 the possible URL values of the grouping table HDU file 
       */

      if(*mbrLocation1 == 0)
	{
	  /* retrieve the possible URLs of the grouping table file */
	  *status = fits_get_url(gfptr,mbrLocation1,mbrLocation2,NULL,NULL,
				 NULL,status);

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation1 != 0 && !fits_is_url_absolute(mbrLocation1) &&
	     *mbrLocation1 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation1)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation1);
	      fits_clean_url(cwd,mbrLocation1,status);
	    }

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation2 != 0 && !fits_is_url_absolute(mbrLocation2) &&
	     *mbrLocation2 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation2)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation2);
	      fits_clean_url(cwd,mbrLocation2,status);
	    }
	}

      /*
	if the member location was specified, then make sure that it is
	either an absolute URL or specifies a full path
      */

      else if(!fits_is_url_absolute(mbrLocation1) && *mbrLocation1 != '/')
	{
	  strcpy(mbrLocation2,mbrLocation1);

	  /* get the possible URLs for the grouping table file */
	  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,NULL,
				 NULL,status);
	  
	  if(*grpLocation1 != 0)
	    {
	      /* make sure the first grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation1) && *grpLocation1 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation1);
		  fits_clean_url(cwd,grpLocation1,status);
		}
	      
	      /* create an absoute URL for the member */

	      fits_relurl2url(grpLocation1,mbrLocation1,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 first location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation1,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation1 = 0;
		}
	    }
	  else
	    *mbrLocation1 = 0;

	  if(*grpLocation2 != 0)
	    {
	      /* make sure the second grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation2) && *grpLocation2 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation2);
		  fits_clean_url(cwd,grpLocation2,status);
		}
	      
	      /* create an absolute URL for the member */

	      fits_relurl2url(grpLocation2,mbrLocation2,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 second location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation2,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation2 = 0;
		}
	    }
	  else
	    *mbrLocation2 = 0;
	}

      /*
	compare the passed member HDU file location string with the
	(possibly two) member location strings to see if there is a match
       */

      if(strcmp(mbrLocation1,tmpLocation) != 0 && 
	 strcmp(mbrLocation2,tmpLocation) != 0   ) continue;
  
      /* if we made it this far then a match to the member HDU was found */
      
      *member = i;
    }

  /* if a match was not found then set the return status code */

  if(*member == 0 && *status == 0) 
    {
      *status = MEMBER_NOT_FOUND;
      ffpmsg("Cannot find specified member HDU (ffgmf)");
    }

  return(*status);
}